

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joystickmenu.cpp
# Opt level: O1

FOptionMenuDescriptor * UpdateJoystickConfigMenu(IJoystickConfig *joy)

{
  TDeletingArray<FOptionMenuItem_*,_FOptionMenuItem_*> *this;
  uint uVar1;
  FOptionMenuDescriptor *this_00;
  long *plVar2;
  int iVar3;
  char *in_RAX;
  long *plVar4;
  FOptionMenuItem *pFVar5;
  FOptionMenuItemOptionBase *pFVar6;
  undefined4 extraout_var;
  int iVar7;
  ulong uVar8;
  FString local_38;
  
  plVar2 = (long *)((long)&(MenuDescriptors.Nodes)->Next +
                   (ulong)((MenuDescriptors.Size - 1 & 0x21f) * 0x18));
  do {
    plVar4 = plVar2;
    if ((plVar4 == (long *)0x0) || ((long *)*plVar4 == (long *)0x1)) {
      plVar4 = (long *)0x0;
      break;
    }
    plVar2 = (long *)*plVar4;
  } while ((int)plVar4[1] != 0x21f);
  if ((plVar4 == (long *)0x0) ||
     (this_00 = (FOptionMenuDescriptor *)plVar4[2], (this_00->super_FMenuDescriptor).mType != 1)) {
    return (FOptionMenuDescriptor *)0x0;
  }
  this = &this_00->mItems;
  local_38.Chars = in_RAX;
  if ((this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count != 0) {
    uVar8 = 0;
    do {
      pFVar5 = (this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>).Array[uVar8];
      if (pFVar5 != (FOptionMenuItem *)0x0) {
        (*(pFVar5->super_FListMenuItem)._vptr_FListMenuItem[1])();
      }
      if ((this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count != 0) {
        (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count = 0;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count);
  }
  if (joy == (IJoystickConfig *)0x0) {
    FString::operator=(&this_00->mTitle,"Configure Controller");
    pFVar5 = (FOptionMenuItem *)operator_new(0x28);
    local_38.Chars = (char *)((ulong)local_38.Chars._4_4_ << 0x20);
    FOptionMenuItem::FOptionMenuItem
              (pFVar5,"Invalid controller specified for menu",(FName *)&local_38,true);
  }
  else {
    (*joy->_vptr_IJoystickConfig[2])(&local_38,joy);
    FString::Format(&this_00->mTitle,"Configure %s",local_38.Chars);
    FString::~FString(&local_38);
    SELECTED_JOYSTICK = joy;
    pFVar5 = (FOptionMenuItem *)operator_new(0x50);
    local_38.Chars._0_4_ = 0;
    FOptionMenuItem::FOptionMenuItem(pFVar5,"Overall sensitivity",(FName *)&local_38,false);
    (pFVar5->super_FListMenuItem)._vptr_FListMenuItem = (_func_int **)&PTR__FOptionMenuItem_006f0bf8
    ;
    pFVar5[1].super_FListMenuItem._vptr_FListMenuItem = (_func_int **)0x0;
    pFVar5[1].super_FListMenuItem.mXpos = 0;
    pFVar5[1].super_FListMenuItem.mYpos = 0x40000000;
    pFVar5[1].super_FListMenuItem.mAction = -0x66666666;
    pFVar5[1].super_FListMenuItem.mEnabled = true;
    *(undefined3 *)&pFVar5[1].super_FListMenuItem.field_0x15 = 0x3fb999;
    pFVar5[1].mLabel.Chars = (char *)0x3;
    *(undefined4 *)&pFVar5[1].mCentered = 0;
    (pFVar5->super_FListMenuItem)._vptr_FListMenuItem = (_func_int **)&PTR__FOptionMenuItem_006f0ed8
    ;
    TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow
              (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,1);
    uVar1 = (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
    (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar1] = pFVar5;
    (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count = uVar1 + 1;
    pFVar5 = (FOptionMenuItem *)operator_new(0x28);
    local_38.Chars = (char *)((ulong)local_38.Chars._4_4_ << 0x20);
    FOptionMenuItem::FOptionMenuItem(pFVar5," ",(FName *)&local_38,true);
    (pFVar5->super_FListMenuItem)._vptr_FListMenuItem = (_func_int **)&PTR__FOptionMenuItem_006f0a50
    ;
    *(EColorRange *)&pFVar5->field_0x24 = OptionSettings.mFontColor;
    TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow
              (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,1);
    uVar1 = (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
    (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar1] = pFVar5;
    (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count = uVar1 + 1;
    iVar3 = (*joy->_vptr_IJoystickConfig[5])(joy);
    pFVar5 = (FOptionMenuItem *)operator_new(0x28);
    if (0 < iVar3) {
      local_38.Chars = (char *)((ulong)local_38.Chars._4_4_ << 0x20);
      FOptionMenuItem::FOptionMenuItem(pFVar5,"Axis Configuration",(FName *)&local_38,true);
      (pFVar5->super_FListMenuItem)._vptr_FListMenuItem =
           (_func_int **)&PTR__FOptionMenuItem_006f0a50;
      *(EColorRange *)&pFVar5->field_0x24 = OptionSettings.mFontColorHeader;
      TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow
                (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,1);
      uVar1 = (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
      (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar1] = pFVar5;
      (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count = uVar1 + 1;
      iVar3 = (*joy->_vptr_IJoystickConfig[5])(joy);
      if (0 < iVar3) {
        uVar8 = 0;
        do {
          pFVar5 = (FOptionMenuItem *)operator_new(0x28);
          local_38.Chars = local_38.Chars & 0xffffffff00000000;
          FOptionMenuItem::FOptionMenuItem(pFVar5," ",(FName *)&local_38,true);
          (pFVar5->super_FListMenuItem)._vptr_FListMenuItem =
               (_func_int **)&PTR__FOptionMenuItem_006f0a50;
          *(EColorRange *)&pFVar5->field_0x24 = OptionSettings.mFontColor;
          TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow
                    (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,1);
          uVar1 = (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
          (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar1] = pFVar5
          ;
          (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count = uVar1 + 1;
          pFVar6 = (FOptionMenuItemOptionBase *)operator_new(0x38);
          iVar7 = (int)uVar8;
          iVar3 = (*joy->_vptr_IJoystickConfig[8])(joy,uVar8);
          FOptionMenuItemOptionBase::FOptionMenuItemOptionBase
                    (pFVar6,(char *)CONCAT44(extraout_var,iVar3),"none","JoyAxisMapNames",
                     (char *)0x0,0);
          (pFVar6->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem =
               (_func_int **)&PTR__FOptionMenuItem_006f0fa8;
          *(int *)&pFVar6->field_0x34 = iVar7;
          TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow
                    (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,1);
          uVar1 = (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
          (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar1] =
               (FOptionMenuItem *)pFVar6;
          (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count = uVar1 + 1;
          pFVar5 = (FOptionMenuItem *)operator_new(0x58);
          local_38.Chars = local_38.Chars & 0xffffffff00000000;
          FOptionMenuItem::FOptionMenuItem(pFVar5,"Overall sensitivity",(FName *)&local_38,false);
          (pFVar5->super_FListMenuItem)._vptr_FListMenuItem =
               (_func_int **)&PTR__FOptionMenuItem_006f0bf8;
          pFVar5[1].super_FListMenuItem._vptr_FListMenuItem = (_func_int **)0x0;
          pFVar5[1].super_FListMenuItem.mXpos = 0;
          pFVar5[1].super_FListMenuItem.mYpos = 0x40100000;
          pFVar5[1].super_FListMenuItem.mAction = -0x66666666;
          pFVar5[1].super_FListMenuItem.mEnabled = true;
          *(undefined3 *)&pFVar5[1].super_FListMenuItem.field_0x15 = 0x3fb999;
          pFVar5[1].mLabel.Chars = (char *)0x3;
          *(undefined4 *)&pFVar5[1].mCentered = 0;
          (pFVar5->super_FListMenuItem)._vptr_FListMenuItem =
               (_func_int **)&PTR__FOptionMenuItem_006f1148;
          *(int *)&pFVar5[1].field_0x24 = iVar7;
          *(undefined4 *)&pFVar5[2].super_FListMenuItem._vptr_FListMenuItem = 1;
          TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow
                    (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,1);
          uVar1 = (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
          (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar1] = pFVar5
          ;
          (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count = uVar1 + 1;
          pFVar6 = (FOptionMenuItemOptionBase *)operator_new(0x38);
          FOptionMenuItemOptionBase::FOptionMenuItemOptionBase
                    (pFVar6,"Invert","none","YesNo",(char *)0x0,0);
          (pFVar6->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem =
               (_func_int **)&PTR__FOptionMenuItem_006f1218;
          *(int *)&pFVar6->field_0x34 = iVar7;
          TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow
                    (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,1);
          uVar1 = (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
          (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar1] =
               (FOptionMenuItem *)pFVar6;
          (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count = uVar1 + 1;
          pFVar5 = (FOptionMenuItem *)operator_new(0x58);
          local_38.Chars = local_38.Chars & 0xffffffff00000000;
          FOptionMenuItem::FOptionMenuItem(pFVar5,"Dead Zone",(FName *)&local_38,false);
          (pFVar5->super_FListMenuItem)._vptr_FListMenuItem =
               (_func_int **)&PTR__FOptionMenuItem_006f0bf8;
          pFVar5[1].super_FListMenuItem._vptr_FListMenuItem = (_func_int **)0x0;
          pFVar5[1].super_FListMenuItem.mXpos = -0x33333333;
          pFVar5[1].super_FListMenuItem.mYpos = 0x3feccccc;
          pFVar5[1].super_FListMenuItem.mAction = -0x66666666;
          pFVar5[1].super_FListMenuItem.mEnabled = true;
          *(undefined3 *)&pFVar5[1].super_FListMenuItem.field_0x15 = 0x3fa999;
          pFVar5[1].mLabel.Chars = (char *)0x3;
          *(undefined4 *)&pFVar5[1].mCentered = 0;
          (pFVar5->super_FListMenuItem)._vptr_FListMenuItem =
               (_func_int **)&PTR__FOptionMenuItem_006f12e8;
          *(int *)&pFVar5[1].field_0x24 = iVar7;
          *(undefined4 *)&pFVar5[2].super_FListMenuItem._vptr_FListMenuItem = 1;
          TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow
                    (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,1);
          uVar1 = (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
          (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar1] = pFVar5
          ;
          (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count = uVar1 + 1;
          uVar8 = (ulong)(iVar7 + 1U);
          iVar3 = (*joy->_vptr_IJoystickConfig[5])(joy);
        } while ((int)(iVar7 + 1U) < iVar3);
      }
      goto LAB_003065e7;
    }
    local_38.Chars = (char *)((ulong)local_38.Chars._4_4_ << 0x20);
    FOptionMenuItem::FOptionMenuItem(pFVar5,"No configurable axes",(FName *)&local_38,true);
  }
  (pFVar5->super_FListMenuItem)._vptr_FListMenuItem = (_func_int **)&PTR__FOptionMenuItem_006f0a50;
  *(EColorRange *)&pFVar5->field_0x24 = OptionSettings.mFontColor;
  TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow
            (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,1);
  uVar1 = (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
  (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar1] = pFVar5;
  (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count = uVar1 + 1;
LAB_003065e7:
  this_00->mScrollPos = 0;
  this_00->mIndent = 0;
  this_00->mSelectedItem = -1;
  this_00->mPosition = -0x19;
  FOptionMenuDescriptor::CalcIndent(this_00);
  return this_00;
}

Assistant:

FOptionMenuDescriptor *UpdateJoystickConfigMenu(IJoystickConfig *joy)
{
	FMenuDescriptor **desc = MenuDescriptors.CheckKey(NAME_JoystickConfigMenu);
	if (desc != NULL && (*desc)->mType == MDESC_OptionsMenu)
	{
		FOptionMenuDescriptor *opt = (FOptionMenuDescriptor *)*desc;
		FOptionMenuItem *it;
		for(unsigned i=0;i<opt->mItems.Size();i++)
		{
			delete opt->mItems[i];
			opt->mItems.Clear();
		}
		if (joy == NULL)
		{
			opt->mTitle = "Configure Controller";
			it = new FOptionMenuItemStaticText("Invalid controller specified for menu", false);
			opt->mItems.Push(it);
		}
		else
		{
			opt->mTitle.Format("Configure %s", joy->GetName().GetChars());

			SELECTED_JOYSTICK = joy;

			it = new FOptionMenuSliderJoySensitivity("Overall sensitivity", 0, 2, 0.1, 3);
			opt->mItems.Push(it);
			it = new FOptionMenuItemStaticText(" ", false);
			opt->mItems.Push(it);

			if (joy->GetNumAxes() > 0)
			{
				it = new FOptionMenuItemStaticText("Axis Configuration", true);
				opt->mItems.Push(it);

				for (int i = 0; i < joy->GetNumAxes(); ++i)
				{
					it = new FOptionMenuItemStaticText(" ", false);
					opt->mItems.Push(it);

					it = new FOptionMenuItemJoyMap(joy->GetAxisName(i), i, "JoyAxisMapNames", false);
					opt->mItems.Push(it);
					it = new FOptionMenuSliderJoyScale("Overall sensitivity", i, 0, 4, 0.1, 3);
					opt->mItems.Push(it);
					it = new FOptionMenuItemInverter("Invert", i, false);
					opt->mItems.Push(it);
					it = new FOptionMenuSliderJoyDeadZone("Dead Zone", i, 0, 0.9, 0.05, 3);
					opt->mItems.Push(it);
				}
			}
			else
			{
				it = new FOptionMenuItemStaticText("No configurable axes", false);
				opt->mItems.Push(it);
			}
		}
		opt->mScrollPos = 0;
		opt->mSelectedItem = -1;
		opt->mIndent = 0;
		opt->mPosition = -25;
		opt->CalcIndent();
		return opt;
	}
	return NULL;
}